

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall soul::AST::Scope::NameSearch::addResult(NameSearch *this,ASTObject *o)

{
  bool bVar1;
  pool_ref<soul::AST::ASTObject> local_18;
  
  bVar1 = contains<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,8ul>,soul::AST::ASTObject&>
                    (&this->itemsFound,o);
  if (!bVar1) {
    local_18.object = o;
    ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::push_back
              (&this->itemsFound,&local_18);
  }
  return;
}

Assistant:

void addResult (ASTObject& o)
            {
                if (! contains (itemsFound, o))
                    itemsFound.push_back (o);
            }